

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vfy.cc
# Opt level: O0

int crl_crldp_check(X509 *x,X509_CRL *crl,int crl_score)

{
  int iVar1;
  DIST_POINT *pDVar2;
  byte local_41;
  DIST_POINT *dp;
  size_t i;
  int crl_score_local;
  X509_CRL *crl_local;
  X509 *x_local;
  
  if ((crl->idp_flags & 0x10U) == 0) {
    if ((x->ex_flags & 0x10) == 0) {
      if ((crl->idp_flags & 8U) != 0) {
        return 0;
      }
    }
    else if ((crl->idp_flags & 4U) != 0) {
      return 0;
    }
    for (dp = (DIST_POINT *)0x0; pDVar2 = (DIST_POINT *)sk_DIST_POINT_num(x->crldp), dp < pDVar2;
        dp = (DIST_POINT *)((long)&dp->distpoint + 1)) {
      pDVar2 = sk_DIST_POINT_value(x->crldp,(size_t)dp);
      if (((pDVar2->reasons == (ASN1_BIT_STRING *)0x0) &&
          (pDVar2->CRLissuer == (GENERAL_NAMES *)0x0)) &&
         ((crl->idp == (ISSUING_DIST_POINT *)0x0 ||
          (iVar1 = idp_check_dp(pDVar2->distpoint,crl->idp->distpoint), iVar1 != 0)))) {
        return 1;
      }
    }
    local_41 = 1;
    if (crl->idp != (ISSUING_DIST_POINT *)0x0) {
      local_41 = crl->idp->distpoint != (DIST_POINT_NAME *)0x0 ^ 0xff;
    }
    x_local._4_4_ = (uint)(local_41 & 1);
  }
  else {
    x_local._4_4_ = 0;
  }
  return x_local._4_4_;
}

Assistant:

static int crl_crldp_check(X509 *x, X509_CRL *crl, int crl_score) {
  // TODO(bbe): crbug.com/409778435 Make tests for the corner cases we hit
  // here so that we stay correct for RFC 5280 6.3.3 steps b.1 and b.2
  if (crl->idp_flags & IDP_ONLYATTR) {
    return 0;
  }
  if (x->ex_flags & EXFLAG_CA) {
    if (crl->idp_flags & IDP_ONLYUSER) {
      return 0;
    }
  } else {
    if (crl->idp_flags & IDP_ONLYCA) {
      return 0;
    }
  }
  for (size_t i = 0; i < sk_DIST_POINT_num(x->crldp); i++) {
    DIST_POINT *dp = sk_DIST_POINT_value(x->crldp, i);
    // Skip distribution points with a reasons field or a CRL issuer:
    //
    // We do not support CRLs partitioned by reason code. RFC 5280 requires CAs
    // include at least one DistributionPoint that covers all reasons.
    //
    // We also do not support indirect CRLs, and a CRL issuer can only match
    // indirect CRLs (RFC 5280, section 6.3.3, step b.1).
    if (dp->reasons != NULL || dp->CRLissuer != NULL) {
      continue;
    }
    // At this point we have already checked that the CRL issuer matches
    // the certificate issuer (and set CRL_SCORE_ISSUER_NAME);

    // RFC 5280 Section 6.3.3 step b.2
    if (!crl->idp || idp_check_dp(dp->distpoint, crl->idp->distpoint)){
      return 1;
    }
  }

  // If the CRL does not specify an issuing distribution point, allow it to
  // match anything.
  //
  // TODO(davidben): Does this match RFC 5280? It's hard to follow because RFC
  // 5280 starts from distribution points, while this starts from CRLs.
  return !crl->idp || !crl->idp->distpoint;
}